

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void FFSFreeMarshalData(SstStream Stream)

{
  void *pvVar1;
  int *__ptr;
  void *pvVar2;
  long lVar3;
  long lVar4;
  void **ppvVar5;
  
  if (Stream->Role == WriterRole) {
    pvVar2 = Stream->WriterMarshalData;
    pvVar1 = Stream->M;
    free(*(void **)((long)pvVar2 + 8));
    if (*(int *)((long)pvVar2 + 0x18) != 0) {
      free_FMfield_list(*(undefined8 *)((long)pvVar2 + 0x20));
    }
    if (*(int *)((long)pvVar2 + 0x30) != 0) {
      free_FMfield_list(*(undefined8 *)((long)pvVar2 + 0x38));
    }
    if (*(long *)((long)pvVar2 + 0x10) != 0) {
      free_FMcontext();
    }
    ppvVar5 = &Stream->M;
    free(pvVar2);
    Stream->WriterMarshalData = (void *)0x0;
    free(Stream->D);
    Stream->D = (void *)0x0;
    free(*(void **)((long)pvVar1 + 8));
    __ptr = (int *)Stream->M;
  }
  else {
    __ptr = (int *)Stream->ReaderMarshalData;
    if (__ptr == (int *)0x0) {
      return;
    }
    ppvVar5 = &Stream->ReaderMarshalData;
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < Stream->WriterCohortSize; lVar4 = lVar4 + 1) {
      free(*(void **)((long)*(void **)(__ptr + 0x10) + lVar3));
      lVar3 = lVar3 + 0x18;
    }
    free(*(void **)(__ptr + 0x10));
    free(*(void **)(__ptr + 8));
    free(*(void **)(__ptr + 10));
    free(*(void **)(__ptr + 0xc));
    free(*(void **)(__ptr + 0xe));
    for (lVar3 = 0; lVar3 < *__ptr; lVar3 = lVar3 + 1) {
      free(*(void **)(*(long *)((long)*(void **)(__ptr + 2) + lVar3 * 8) + 8));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x10));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x38));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x30));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x40));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x48));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x50));
      free(*(void **)(*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) + 0x58));
      free(*(void **)(*(long *)(__ptr + 2) + lVar3 * 8));
    }
    free(*(void **)(__ptr + 2));
    pvVar2 = *(void **)(__ptr + 0x12);
    __ptr[0x12] = 0;
    __ptr[0x13] = 0;
    while (pvVar2 != (void *)0x0) {
      pvVar1 = *(void **)((long)pvVar2 + 0x10);
      free(pvVar2);
      pvVar2 = pvVar1;
    }
  }
  free(__ptr);
  *ppvVar5 = (void *)0x0;
  return;
}

Assistant:

extern void FFSFreeMarshalData(SstStream Stream)
{
    if (Stream->Role == WriterRole)
    {
        /* writer side */
        struct FFSWriterMarshalBase *Info =
            (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
        struct FFSMetadataInfoStruct *MBase;
        MBase = Stream->M;

        for (int i = 0; i < Info->RecCount; i++)
        {
            //            free(Info->RecList[i].Type);
        }
        if (Info->RecList)
            free(Info->RecList);
        if (Info->MetaFieldCount)
            free_FMfield_list(Info->MetaFields);
        if (Info->DataFieldCount)
            free_FMfield_list(Info->DataFields);
        if (Info->LocalFMContext)
            free_FMcontext(Info->LocalFMContext);
        free(Info);
        Stream->WriterMarshalData = NULL;
        free(Stream->D);
        Stream->D = NULL;
        free(MBase->BitField);
        free(Stream->M);
        Stream->M = NULL;
    }
    else
    {
        /* reader side */
        struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
        if (Info)
        {
            int i;
            for (i = 0; i < Stream->WriterCohortSize; i++)
            {
                if (Info->WriterInfo[i].RawBuffer)
                    free(Info->WriterInfo[i].RawBuffer);
            }
            if (Info->WriterInfo)
                free(Info->WriterInfo);
            if (Info->MetadataBaseAddrs)
                free(Info->MetadataBaseAddrs);
            if (Info->MetadataFieldLists)
                free(Info->MetadataFieldLists);
            if (Info->DataBaseAddrs)
                free(Info->DataBaseAddrs);
            if (Info->DataFieldLists)
                free(Info->DataFieldLists);
            for (i = 0; i < Info->VarCount; i++)
            {
                free(Info->VarList[i]->VarName);
                free(Info->VarList[i]->PerWriterMetaFieldOffset);
                free(Info->VarList[i]->PerWriterBlockCount);
                free(Info->VarList[i]->PerWriterBlockStart);
                free(Info->VarList[i]->PerWriterStart);
                free(Info->VarList[i]->PerWriterCounts);
                free(Info->VarList[i]->PerWriterIncomingData);
                free(Info->VarList[i]->PerWriterIncomingSize);
                free(Info->VarList[i]);
            }
            if (Info->VarList)
                free(Info->VarList);

            struct ControlInfo *tmp = Info->ControlBlocks;
            Info->ControlBlocks = NULL;
            while (tmp)
            {
                struct ControlInfo *next = tmp->Next;
                free(tmp);
                tmp = next;
            }
            free(Info);
            Stream->ReaderMarshalData = NULL;
        }
    }
}